

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Record.h
# Opt level: O3

void __thiscall
KDIS::UTILS::DIS_Logger_Record::Record<unsigned_int>
          (DIS_Logger_Record *this,uint Stamp,KDataStream *Stream)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_1c8;
  stringstream local_1a8 [16];
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  KDataStream::GetAsString_abi_cxx11_(&local_1c8,Stream);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (this->m_bWriteToFile == true) {
    std::__cxx11::stringbuf::str();
    writeToFile(this,&local_1c8);
  }
  else {
    std::__cxx11::stringbuf::str();
    writeToBuffer(this,&local_1c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void DIS_Logger_Record::Record(Type Stamp, const KDataStream &Stream) noexcept(false)
{
    KStringStream ss;
    ss << Stamp << "\n" << Stream.GetAsString();
    m_bWriteToFile ? writeToFile( ss.str() ) : writeToBuffer( ss.str() );
}